

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

bool loadResources(void)

{
  bool bVar1;
  char cVar2;
  ResourceManager *this;
  DisplayResource *this_00;
  Player *this_01;
  Input *this_02;
  FontResource *pFVar3;
  char *pcVar4;
  BitmapResource *this_03;
  SampleResource *this_04;
  StreamResource *this_05;
  char **ppcVar5;
  
  this = ResourceManager::getInstance();
  this_00 = (DisplayResource *)operator_new(0x18);
  DisplayResource::DisplayResource(this_00);
  bVar1 = ResourceManager::add(this,(Resource *)this_00,true);
  if (bVar1) {
    cVar2 = al_install_audio();
    if (cVar2 == '\0') {
      puts("Failed to install audio.");
    }
    else {
      al_reserve_samples(0x10);
    }
    this_01 = (Player *)operator_new(0x88);
    Player::Player(this_01);
    bVar1 = ResourceManager::add(this,&this_01->super_Resource,false);
    if (bVar1) {
      this_02 = (Input *)operator_new(0x188);
      Input::Input(this_02);
      bVar1 = ResourceManager::add(this,(Resource *)this_02,true);
      if (bVar1) {
        pFVar3 = (FontResource *)operator_new(0x30);
        pcVar4 = getResource("gfx/large_font.png");
        FontResource::FontResource(pFVar3,pcVar4);
        bVar1 = ResourceManager::add(this,(Resource *)pFVar3,true);
        if (!bVar1) {
          return false;
        }
        pFVar3 = (FontResource *)operator_new(0x30);
        pcVar4 = getResource("gfx/small_font.png");
        FontResource::FontResource(pFVar3,pcVar4);
        bVar1 = ResourceManager::add(this,(Resource *)pFVar3,true);
        if (!bVar1) {
          return false;
        }
        if (BMP_NAMES[0] != (char *)0x0) {
          ppcVar5 = BMP_NAMES;
          pcVar4 = BMP_NAMES[0];
          do {
            ppcVar5 = ppcVar5 + 1;
            this_03 = (BitmapResource *)operator_new(0x30);
            pcVar4 = getResource(pcVar4);
            BitmapResource::BitmapResource(this_03,pcVar4);
            bVar1 = ResourceManager::add(this,(Resource *)this_03,true);
            if (!bVar1) {
              pcVar4 = getResource(ppcVar5[-1]);
              printf("Failed to load %s\n",pcVar4);
              return false;
            }
            pcVar4 = *ppcVar5;
          } while (pcVar4 != (char *)0x0);
        }
        if (SAMPLE_NAMES[0] != (char *)0x0) {
          ppcVar5 = SAMPLE_NAMES;
          pcVar4 = SAMPLE_NAMES[0];
          do {
            ppcVar5 = ppcVar5 + 1;
            this_04 = (SampleResource *)operator_new(0x30);
            pcVar4 = getResource(pcVar4);
            SampleResource::SampleResource(this_04,pcVar4);
            ResourceManager::add(this,(Resource *)this_04,true);
            pcVar4 = *ppcVar5;
          } while (pcVar4 != (char *)0x0);
        }
        if (STREAM_NAMES[0] != (char *)0x0) {
          ppcVar5 = STREAM_NAMES;
          pcVar4 = STREAM_NAMES[0];
          do {
            ppcVar5 = ppcVar5 + 1;
            this_05 = (StreamResource *)operator_new(0x30);
            pcVar4 = getResource(pcVar4);
            StreamResource::StreamResource(this_05,pcVar4);
            ResourceManager::add(this,(Resource *)this_05,true);
            pcVar4 = *ppcVar5;
          } while (pcVar4 != (char *)0x0);
        }
        joypad_start();
        return true;
      }
      pcVar4 = "Failed initializing input.";
    }
    else {
      pcVar4 = "Failed to create player.";
    }
  }
  else {
    pcVar4 = "Failed to create display.";
  }
  puts(pcVar4);
  return false;
}

Assistant:

bool loadResources(void)
{
   ResourceManager& rm = ResourceManager::getInstance();
   if (!rm.add(new DisplayResource())) {
      printf("Failed to create display.\n");
      return false;
   }

   /* For some reason dsound needs a window... */
   if (!al_install_audio()) {
      printf("Failed to install audio.\n");
      /* Continue anyway. */
   }
   else {
      al_reserve_samples(16);
   }

   if (!rm.add(new Player(), false)) {
      printf("Failed to create player.\n");
      return false;
   }
   if (!rm.add(new Input())) {
      printf("Failed initializing input.\n");
      return false;
   }

   // Load fonts
   if (!rm.add(new FontResource(getResource("gfx/large_font.png"))))
      return false;
   if (!rm.add(new FontResource(getResource("gfx/small_font.png"))))
      return false;

   for (int i = 0; BMP_NAMES[i]; i++) {
      if (!rm.add(new BitmapResource(getResource(BMP_NAMES[i])))) {
         printf("Failed to load %s\n", getResource(BMP_NAMES[i]));
         return false;
      }
   }

   for (int i = 0; SAMPLE_NAMES[i]; i++) {
      if (!rm.add(new SampleResource(getResource(SAMPLE_NAMES[i])))) {
         /* Continue anyway. */
      }
   }

   for (int i = 0; STREAM_NAMES[i]; i++) {
      if (!rm.add(new StreamResource(getResource(STREAM_NAMES[i])))) {
         /* Continue anyway. */
      }
   }

   joypad_start();

   return true;
}